

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O1

void mpc_sbox_verify_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  word128 x1s [2] [2];
  word128 r1m [2] [2];
  word128 x2m [2] [2];
  word128 r1s [2] [2];
  word128 r0s [2] [2];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 auStack_88 [8];
  word128 x0s [2] [2];
  word128 r2m [2] [2];
  
  auVar6 = *(undefined1 (*) [16])mask_a->w64;
  auVar7 = *(undefined1 (*) [16])(mask_a->w64 + 2);
  auVar5 = *(undefined1 (*) [16])mask_b->w64;
  auVar9 = *(undefined1 (*) [16])(mask_b->w64 + 2);
  auVar3 = *(undefined1 (*) [16])mask_c->w64;
  auVar4 = *(undefined1 (*) [16])(mask_c->w64 + 2);
  lVar1 = 0;
  do {
    auVar2 = *(undefined1 (*) [16])((long)in->w64 + lVar1);
    auVar8 = *(undefined1 (*) [16])((long)in->w64 + lVar1 + 0x10);
    auVar10 = vandps_avx(auVar2,auVar6);
    *(undefined1 (*) [16])(local_208 + lVar1) = auVar10;
    auVar10 = vandps_avx(auVar8,auVar7);
    *(undefined1 (*) [16])(local_1f8 + lVar1) = auVar10;
    auVar10 = vandps_avx(auVar2,auVar5);
    *(undefined1 (*) [16])(local_148 + lVar1) = auVar10;
    auVar10 = vandps_avx(auVar8,auVar9);
    *(undefined1 (*) [16])(local_138 + lVar1) = auVar10;
    auVar2 = vandps_avx(auVar2,auVar3);
    *(undefined1 (*) [16])(local_c8 + lVar1) = auVar2;
    auVar2 = vandps_avx(auVar8,auVar4);
    *(undefined1 (*) [16])(local_b8 + lVar1) = auVar2;
    auVar2 = *(undefined1 (*) [16])(local_208 + lVar1);
    auVar8 = vpsrldq_avx(auVar2,8);
    auVar8 = vpsrlq_avx(auVar8,0x3e);
    auVar10 = vpslldq_avx(auVar2,8);
    auVar2 = vpshldq_avx512_vbmi2(auVar2,auVar10,2);
    *(undefined1 (*) [16])(local_208 + lVar1) = auVar2;
    auVar2 = vpslldq_avx(*(undefined1 (*) [16])(local_1f8 + lVar1),8);
    auVar2 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(local_1f8 + lVar1),auVar2,2);
    auVar2 = vpor_avx(auVar2,auVar8);
    *(undefined1 (*) [16])(local_1f8 + lVar1) = auVar2;
    auVar2 = *(undefined1 (*) [16])(local_148 + lVar1);
    auVar8 = vpsrldq_avx(auVar2,8);
    auVar8 = vpsrlq_avx(auVar8,0x3f);
    auVar10 = vpslldq_avx(auVar2,8);
    auVar2 = vpshldq_avx512_vbmi2(auVar2,auVar10,1);
    *(undefined1 (*) [16])(local_148 + lVar1) = auVar2;
    auVar2 = vpslldq_avx(*(undefined1 (*) [16])(local_138 + lVar1),8);
    auVar2 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(local_138 + lVar1),auVar2,1);
    auVar2 = vpor_avx(auVar2,auVar8);
    *(undefined1 (*) [16])(local_138 + lVar1) = auVar2;
    auVar2 = *(undefined1 (*) [16])((long)rvec + lVar1);
    auVar8 = *(undefined1 (*) [16])((long)rvec + lVar1 + 0x10);
    auVar10 = vandps_avx(auVar2,auVar6);
    *(undefined1 (*) [16])(local_188 + lVar1) = auVar10;
    auVar10 = vandps_avx(auVar8,auVar7);
    *(undefined1 (*) [16])(local_178 + lVar1) = auVar10;
    auVar10 = vandps_avx(auVar2,auVar5);
    *(undefined1 (*) [16])(local_108 + lVar1) = auVar10;
    auVar10 = vandps_avx(auVar8,auVar9);
    *(undefined1 (*) [16])(local_f8 + lVar1) = auVar10;
    auVar2 = vandps_avx(auVar2,auVar3);
    *(undefined1 (*) [16])(local_1c8 + lVar1) = auVar2;
    auVar2 = vandps_avx(auVar8,auVar4);
    *(undefined1 (*) [16])(local_1b8 + lVar1) = auVar2;
    auVar2 = *(undefined1 (*) [16])(local_188 + lVar1);
    auVar8 = vpsrldq_avx(auVar2,8);
    auVar8 = vpsrlq_avx(auVar8,0x3e);
    auVar10 = vpslldq_avx(auVar2,8);
    auVar2 = vpshldq_avx512_vbmi2(auVar2,auVar10,2);
    *(undefined1 (*) [16])((long)x0s[1][1] + lVar1 + 8) = auVar2;
    auVar2 = vpslldq_avx(*(undefined1 (*) [16])(local_178 + lVar1),8);
    auVar2 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(local_178 + lVar1),auVar2,2);
    auVar2 = vpor_avx(auVar2,auVar8);
    *(undefined1 (*) [16])((long)r2m[0][0] + lVar1 + 8) = auVar2;
    auVar2 = *(undefined1 (*) [16])(local_108 + lVar1);
    auVar8 = vpsrldq_avx(auVar2,8);
    auVar8 = vpsrlq_avx(auVar8,0x3f);
    auVar10 = vpslldq_avx(auVar2,8);
    auVar2 = vpshldq_avx512_vbmi2(auVar2,auVar10,1);
    *(undefined1 (*) [16])(auStack_88 + lVar1) = auVar2;
    auVar2 = vpslldq_avx(*(undefined1 (*) [16])(local_f8 + lVar1),8);
    auVar2 = vpshldq_avx512_vbmi2(*(undefined1 (*) [16])(local_f8 + lVar1),auVar2,1);
    auVar2 = vpor_avx(auVar2,auVar8);
    *(undefined1 (*) [16])((long)x0s[0][0] + lVar1 + 8) = auVar2;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 == 0x20);
  auVar6 = vpand_avx(local_208 ^ local_1e8,local_148);
  auVar7 = vpand_avx(local_1f8 ^ local_1d8,local_138);
  auVar5 = vpand_avx(local_128,local_208);
  auVar9 = vpand_avx(local_118,local_1f8);
  local_188 = vpternlogq_avx512vl(local_1c8 ^ local_1a8,auVar5,auVar6,0x96);
  local_178 = vpternlogq_avx512vl(local_1b8 ^ local_198,auVar9,auVar7,0x96);
  *(undefined1 (*) [16])view = local_188;
  *(undefined1 (*) [16])(view->t + 2) = local_178;
  auVar6 = *(undefined1 (*) [16])(view->t + 4);
  auVar7 = *(undefined1 (*) [16])(view->t + 6);
  local_168 = vandpd_avx(auVar6,*(undefined1 (*) [16])mask_c->w64);
  local_158 = vandpd_avx(auVar7,*(undefined1 (*) [16])(mask_c->w64 + 2));
  auVar3 = vpternlogq_avx512vl(local_128,local_c8,local_148,0x48);
  auVar4 = vpternlogq_avx512vl(local_118,local_b8,local_138,0x48);
  auVar5 = vpand_avx(local_a8,local_148);
  auVar9 = vpand_avx(local_98,local_138);
  auVar2 = vmovdqa64_avx512vl(_auStack_88);
  auVar8 = vmovdqa64_avx512vl(x0s[0]._8_16_);
  auVar2 = vpxorq_avx512vl(auVar2,x0s._24_16_);
  auVar5 = vpternlogq_avx512vl(auVar2,auVar5,auVar3,0x96);
  local_1c8 = vmovdqa64_avx512vl(auVar5);
  auVar3 = vpxorq_avx512vl(auVar8,x0s[1]._8_16_);
  local_1b8 = vpternlogq_avx512vl(auVar3,auVar9,auVar4,0x96);
  auVar9 = vpslldq_avx(local_1b8,8);
  auVar9 = vpsllq_avx(auVar9,0x3f);
  auVar11 = vpsrldq_avx512vl(auVar5,8);
  auVar5 = vpshldq_avx512_vbmi2(auVar11._0_16_,auVar5,0x3f);
  auVar3 = vpsrldq_avx(local_1b8,8);
  auVar2 = vpshldq_avx512_vbmi2(auVar3,local_1b8,0x3f);
  auVar8 = vpternlogq_avx512vl(auVar5,local_188,auVar9,0x36);
  *(undefined1 (*) [16])view = auVar8;
  *(undefined1 (*) [16])(view->t + 2) = local_178 ^ auVar2;
  auVar10 = vpsrldq_avx(auVar6,8);
  auVar3 = vpsrlq_avx(auVar10,0x3f);
  auVar12 = vpslldq_avx(auVar6,8);
  auVar5 = vpshldq_avx512_vbmi2(auVar6,auVar12,1);
  auVar11 = vpslldq_avx512vl(auVar7,8);
  auVar9 = vpshldq_avx512_vbmi2(auVar7,auVar11._0_16_,1);
  local_1a8 = vpand_avx(auVar5,*(undefined1 (*) [16])mask_c->w64);
  auVar5 = vpternlogq_avx512vl(auVar9,auVar3,*(undefined1 (*) [16])(mask_c->w64 + 2),0xa8);
  local_198 = vmovdqa64_avx512vl(auVar5);
  auVar5 = vpand_avx(local_c8,local_208 ^ local_1e8);
  auVar9 = vpand_avx(local_b8,local_1f8 ^ local_1d8);
  auVar3 = vpand_avx(local_a8,local_208);
  auVar4 = vpand_avx(local_98,local_1f8);
  local_108 = vpternlogq_avx512vl(stack0xffffffffffffffb8 ^ r2m._24_16_,auVar3,auVar5,0x96);
  local_f8 = vpternlogq_avx512vl(r2m[0]._8_16_ ^ r2m[1]._8_16_,auVar4,auVar9,0x96);
  auVar5 = vpslldq_avx(local_f8,8);
  auVar3 = vpsllq_avx(auVar5,0x3e);
  auVar5 = vpsrldq_avx(local_108,8);
  auVar5 = vpshldq_avx512_vbmi2(auVar5,local_108,0x3e);
  auVar9 = vpsrldq_avx(local_f8,8);
  auVar9 = vpshldq_avx512_vbmi2(auVar9,local_f8,0x3e);
  auVar5 = vpternlogq_avx512vl(auVar5,auVar8,auVar3,0x36);
  *(undefined1 (*) [16])view = auVar5;
  *(undefined1 (*) [16])(view->t + 2) = auVar9 ^ local_178 ^ auVar2;
  auVar5 = vpsrlq_avx(auVar10,0x3e);
  auVar6 = vpshldq_avx512_vbmi2(auVar6,auVar12,2);
  auVar7 = vpshldq_avx512_vbmi2(auVar7,auVar11._0_16_,2);
  local_e8 = vpand_avx(auVar6,*(undefined1 (*) [16])mask_c->w64);
  local_d8 = vpternlogq_avx512vl(auVar7,auVar5,*(undefined1 (*) [16])(mask_c->w64 + 2),0xa8);
  lVar1 = 0;
  do {
    *(undefined1 (*) [16])(local_1c8 + lVar1) =
         *(undefined1 (*) [16])(local_208 + lVar1) ^ *(undefined1 (*) [16])(local_1c8 + lVar1);
    *(undefined1 (*) [16])(local_1b8 + lVar1) =
         *(undefined1 (*) [16])(local_1f8 + lVar1) ^ *(undefined1 (*) [16])(local_1b8 + lVar1);
    auVar9 = *(undefined1 (*) [16])(local_208 + lVar1) ^ *(undefined1 (*) [16])(local_148 + lVar1);
    *(undefined1 (*) [16])(local_208 + lVar1) = auVar9;
    auVar3 = *(undefined1 (*) [16])(local_1f8 + lVar1) ^ *(undefined1 (*) [16])(local_138 + lVar1);
    *(undefined1 (*) [16])(local_1f8 + lVar1) = auVar3;
    *(undefined1 (*) [16])(local_108 + lVar1) = auVar9 ^ *(undefined1 (*) [16])(local_108 + lVar1);
    auVar6 = *(undefined1 (*) [16])(local_f8 + lVar1);
    *(undefined1 (*) [16])(local_f8 + lVar1) = auVar3 ^ auVar6;
    auVar7 = *(undefined1 (*) [16])(local_188 + lVar1);
    *(undefined1 (*) [16])(local_188 + lVar1) = auVar9 ^ auVar7;
    auVar5 = *(undefined1 (*) [16])(local_178 + lVar1);
    *(undefined1 (*) [16])(local_178 + lVar1) = auVar3 ^ auVar5;
    auVar9 = auVar9 ^ auVar7 ^ *(undefined1 (*) [16])(local_c8 + lVar1);
    *(undefined1 (*) [16])(local_188 + lVar1) = auVar9;
    auVar5 = auVar3 ^ auVar5 ^ *(undefined1 (*) [16])(local_b8 + lVar1);
    *(undefined1 (*) [16])(local_178 + lVar1) = auVar5;
    auVar7 = vpslldq_avx(*(undefined1 (*) [16])(local_1b8 + lVar1),8);
    auVar2 = vpsllq_avx(auVar7,0x3e);
    auVar7 = vpsrldq_avx(*(undefined1 (*) [16])(local_1c8 + lVar1),8);
    auVar7 = vpshldq_avx512_vbmi2(auVar7,*(undefined1 (*) [16])(local_1c8 + lVar1),0x3e);
    *(undefined1 (*) [16])(local_208 + lVar1) = auVar7;
    auVar4 = vpsrldq_avx(*(undefined1 (*) [16])(local_1b8 + lVar1),8);
    auVar4 = vpshldq_avx512_vbmi2(auVar4,*(undefined1 (*) [16])(local_1b8 + lVar1),0x3e);
    *(undefined1 (*) [16])(local_1f8 + lVar1) = auVar4;
    auVar7 = vpor_avx(auVar7,auVar2);
    *(undefined1 (*) [16])(local_208 + lVar1) = auVar7;
    auVar2 = vpslldq_avx(*(undefined1 (*) [16])(local_f8 + lVar1),8);
    auVar10 = vpsllq_avx(auVar2,0x3f);
    auVar2 = vpsrldq_avx(*(undefined1 (*) [16])(local_108 + lVar1),8);
    auVar2 = vpshldq_avx512_vbmi2(auVar2,*(undefined1 (*) [16])(local_108 + lVar1),0x3f);
    *(undefined1 (*) [16])(local_148 + lVar1) = auVar2;
    auVar8 = vpsrldq_avx(*(undefined1 (*) [16])(local_f8 + lVar1),8);
    auVar3 = vpshldq_avx512_vbmi2(auVar8,auVar3 ^ auVar6,0x3f);
    *(undefined1 (*) [16])(local_138 + lVar1) = auVar3;
    auVar6 = vpor_avx(auVar2,auVar10);
    *(undefined1 (*) [16])(local_148 + lVar1) = auVar6;
    *(undefined1 (*) [16])(local_208 + lVar1) = auVar6 ^ auVar7;
    *(undefined1 (*) [16])(local_1f8 + lVar1) = auVar3 ^ auVar4;
    auVar9 = auVar6 ^ auVar7 ^ auVar9;
    *(undefined1 (*) [16])(local_188 + lVar1) = auVar9;
    auVar5 = auVar3 ^ auVar4 ^ auVar5;
    *(undefined1 (*) [16])(local_178 + lVar1) = auVar5;
    *(undefined1 (*) [16])((long)out->w64 + lVar1) = auVar9;
    *(undefined1 (*) [16])((long)out->w64 + lVar1 + 0x10) = auVar5;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 == 0x20);
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_verify_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                            const rvec_t* rvec, const mzd_local_t* mask_a,
                                            const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_VERIFY, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_verify_def(NROLR, NROLR, r0m, x0s, x1s, r2m, mask_c, 0);
  // b & c
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r2m, x1s, x2m, r1s,
                               mask_c, 1);
  // c & a
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r1m, x0s, x2m, r0s,
                               mask_c, 2);

  bitsliced_mm128_256_step_2(SC_VERIFY);
}